

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PingId.cpp
# Opt level: O1

ssize_t __thiscall Vault::Sys::Mfa::PingId::read(PingId *this,int __fd,void *__buf,size_t __nbytes)

{
  void *__buf_00;
  undefined4 in_register_00000034;
  Url local_38;
  
  __buf_00 = *(void **)CONCAT44(in_register_00000034,__fd);
  getUrl(&local_38,(PingId *)CONCAT44(in_register_00000034,__fd),(Path *)__buf);
  Mfa::read((int)this,__buf_00,(size_t)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.value_._M_dataplus._M_p != &local_38.value_.field_2) {
    operator_delete(local_38.value_._M_dataplus._M_p,
                    local_38.value_.field_2._M_allocated_capacity + 1);
  }
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Sys::Mfa::PingId::read(const Path &path) {
  return Vault::Sys::Mfa::read(client_, getUrl(path));
}